

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Core.c
# Opt level: O0

void Llb_CoreSetVarMaps(Llb_Img_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  Aig_Obj_t *pObj_00;
  int iVarNs;
  int iVarCs;
  int i;
  Aig_Obj_t *pObj;
  Llb_Img_t *p_local;
  
  if (p->vVarsCs == (Vec_Int_t *)0x0) {
    __assert_fail("p->vVarsCs != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/llb/llb2Core.c"
                  ,0x245,"void Llb_CoreSetVarMaps(Llb_Img_t *)");
  }
  if (p->vVarsNs == (Vec_Int_t *)0x0) {
    __assert_fail("p->vVarsNs != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/llb/llb2Core.c"
                  ,0x246,"void Llb_CoreSetVarMaps(Llb_Img_t *)");
  }
  if (p->vCs2Glo != (Vec_Int_t *)0x0) {
    __assert_fail("p->vCs2Glo == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/llb/llb2Core.c"
                  ,0x247,"void Llb_CoreSetVarMaps(Llb_Img_t *)");
  }
  if (p->vNs2Glo == (Vec_Int_t *)0x0) {
    if (p->vGlo2Cs != (Vec_Int_t *)0x0) {
      __assert_fail("p->vGlo2Cs == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/llb/llb2Core.c"
                    ,0x249,"void Llb_CoreSetVarMaps(Llb_Img_t *)");
    }
    if (p->vGlo2Ns == (Vec_Int_t *)0x0) {
      iVar1 = Aig_ManObjNumMax(p->pAig);
      pVVar4 = Vec_IntStartFull(iVar1);
      p->vCs2Glo = pVVar4;
      iVar1 = Aig_ManObjNumMax(p->pAig);
      pVVar4 = Vec_IntStartFull(iVar1);
      p->vNs2Glo = pVVar4;
      iVar1 = Aig_ManRegNum(p->pAig);
      pVVar4 = Vec_IntStartFull(iVar1);
      p->vGlo2Cs = pVVar4;
      iVar1 = Aig_ManRegNum(p->pAig);
      pVVar4 = Vec_IntStartFull(iVar1);
      p->vGlo2Ns = pVVar4;
      iVarNs = 0;
      while( true ) {
        iVar1 = Aig_ManRegNum(p->pAig);
        if (iVar1 <= iVarNs) {
          for (iVarNs = 0; iVar1 = Saig_ManPiNum(p->pAig), iVarNs < iVar1; iVarNs = iVarNs + 1) {
            pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vCis,iVarNs);
            pVVar4 = p->vCs2Glo;
            iVar1 = Aig_ObjId(pObj_00);
            iVar2 = Aig_ManRegNum(p->pAig);
            Vec_IntWriteEntry(pVVar4,iVar1,iVar2 + iVarNs);
          }
          return;
        }
        iVar1 = Vec_IntEntry(p->vVarsCs,iVarNs);
        iVar2 = Vec_IntEntry(p->vVarsNs,iVarNs);
        if ((iVar1 < 0) || (iVar3 = Aig_ManObjNumMax(p->pAig), iVar3 <= iVar1)) break;
        if ((iVar2 < 0) || (iVar3 = Aig_ManObjNumMax(p->pAig), iVar3 <= iVar2)) {
          __assert_fail("iVarNs >= 0 && iVarNs < Aig_ManObjNumMax(p->pAig)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/llb/llb2Core.c"
                        ,0x254,"void Llb_CoreSetVarMaps(Llb_Img_t *)");
        }
        Vec_IntWriteEntry(p->vCs2Glo,iVar1,iVarNs);
        Vec_IntWriteEntry(p->vNs2Glo,iVar2,iVarNs);
        Vec_IntWriteEntry(p->vGlo2Cs,iVarNs,iVar1);
        Vec_IntWriteEntry(p->vGlo2Ns,iVarNs,iVar2);
        iVarNs = iVarNs + 1;
      }
      __assert_fail("iVarCs >= 0 && iVarCs < Aig_ManObjNumMax(p->pAig)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/llb/llb2Core.c"
                    ,0x253,"void Llb_CoreSetVarMaps(Llb_Img_t *)");
    }
    __assert_fail("p->vGlo2Ns == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/llb/llb2Core.c"
                  ,0x24a,"void Llb_CoreSetVarMaps(Llb_Img_t *)");
  }
  __assert_fail("p->vNs2Glo == NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/llb/llb2Core.c"
                ,0x248,"void Llb_CoreSetVarMaps(Llb_Img_t *)");
}

Assistant:

void Llb_CoreSetVarMaps( Llb_Img_t * p )
{
    Aig_Obj_t * pObj;
    int i, iVarCs, iVarNs;
    assert( p->vVarsCs != NULL );
    assert( p->vVarsNs != NULL );
    assert( p->vCs2Glo == NULL );
    assert( p->vNs2Glo == NULL );
    assert( p->vGlo2Cs == NULL );
    assert( p->vGlo2Ns == NULL );
    p->vCs2Glo = Vec_IntStartFull( Aig_ManObjNumMax(p->pAig) );
    p->vNs2Glo = Vec_IntStartFull( Aig_ManObjNumMax(p->pAig) );
    p->vGlo2Cs = Vec_IntStartFull( Aig_ManRegNum(p->pAig) );
    p->vGlo2Ns = Vec_IntStartFull( Aig_ManRegNum(p->pAig) );
    for ( i = 0; i < Aig_ManRegNum(p->pAig); i++ )
    {
        iVarCs = Vec_IntEntry( p->vVarsCs, i );
        iVarNs = Vec_IntEntry( p->vVarsNs, i );
        assert( iVarCs >= 0 && iVarCs < Aig_ManObjNumMax(p->pAig) );
        assert( iVarNs >= 0 && iVarNs < Aig_ManObjNumMax(p->pAig) );
        Vec_IntWriteEntry( p->vCs2Glo, iVarCs, i );
        Vec_IntWriteEntry( p->vNs2Glo, iVarNs, i );
        Vec_IntWriteEntry( p->vGlo2Cs, i, iVarCs );
        Vec_IntWriteEntry( p->vGlo2Ns, i, iVarNs );
    }
    // add mapping of the PIs
    Saig_ManForEachPi( p->pAig, pObj, i )
        Vec_IntWriteEntry( p->vCs2Glo, Aig_ObjId(pObj), Aig_ManRegNum(p->pAig)+i );
}